

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgGoogol.cpp
# Opt level: O1

void __thiscall dgGoogol::ShiftRightMantissa(dgGoogol *this,HaU64 *mantissa,HaI32 bits)

{
  bool bVar1;
  HaU64 HVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  
  uVar3 = (long)*mantissa >> 0x3f;
  if (0x3f < bits) {
    uVar4 = bits;
    do {
      HVar2 = mantissa[1];
      mantissa[3] = mantissa[2];
      mantissa[1] = *mantissa;
      mantissa[2] = HVar2;
      *mantissa = uVar3;
      bits = uVar4 - 0x40;
      bVar1 = 0x7f < (int)uVar4;
      uVar4 = bits;
    } while (bVar1);
  }
  if (0 < bits) {
    lVar5 = 0;
    do {
      uVar6 = uVar3 << ((ulong)(0x40 - bits) & 0x3f);
      uVar3 = mantissa[lVar5];
      mantissa[lVar5] = uVar3 >> ((ulong)(uint)bits & 0x3f) | uVar6;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
  }
  return;
}

Assistant:

void dgGoogol::ShiftRightMantissa (hacd::HaU64* const mantissa, hacd::HaI32 bits) const
{
	hacd::HaU64 carrier = 0;
	if (hacd::HaI64 (mantissa[0]) < hacd::HaI64 (0)) {
		carrier = hacd::HaU64 (-1);
	}
	
	while (bits >= 64) {
		for (hacd::HaI32 i = DG_GOOGOL_SIZE - 2; i >= 0; i --) {
			mantissa[i + 1] = mantissa[i];
		}
		mantissa[0] = carrier;
		bits -= 64;
	}

	if (bits > 0) {
		carrier <<= (64 - bits);
		for (hacd::HaI32 i = 0; i < DG_GOOGOL_SIZE; i ++) {
			hacd::HaU64 a = mantissa[i];
			mantissa[i] = (a >> bits) | carrier;
			carrier = a << (64 - bits);
		}
	}
}